

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O2

void __thiscall BuildStatus::BuildStatus(BuildStatus *this,BuildConfig *config)

{
  _Rb_tree_header *p_Var1;
  int64_t iVar2;
  char *pcVar3;
  char *pcVar4;
  
  this->config_ = config;
  iVar2 = GetTimeMillis();
  this->start_time_millis_ = iVar2;
  this->started_edges_ = 0;
  this->finished_edges_ = 0;
  this->total_edges_ = 0;
  (this->running_edges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->running_edges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->running_edges_)._M_t._M_impl.super__Rb_tree_header;
  (this->running_edges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->running_edges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->running_edges_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  LinePrinter::LinePrinter(&this->printer_);
  this->progress_status_format_ = (char *)0x0;
  (this->overall_rate_).rate_ = -1.0;
  (this->overall_rate_).stopwatch_.started_ = 0;
  SlidingRateInfo::SlidingRateInfo(&this->current_rate_,*(int *)(config + 8));
  if (*(int *)this->config_ != 0) {
    (this->printer_).smart_terminal_ = false;
  }
  pcVar3 = getenv("NINJA_STATUS");
  pcVar4 = "[%f/%t] ";
  if (pcVar3 != (char *)0x0) {
    pcVar4 = pcVar3;
  }
  this->progress_status_format_ = pcVar4;
  return;
}

Assistant:

BuildStatus::BuildStatus(const BuildConfig& config)
    : config_(config), start_time_millis_(GetTimeMillis()), started_edges_(0),
      finished_edges_(0), total_edges_(0), progress_status_format_(NULL),
      current_rate_(config.parallelism) {
  // Don't do anything fancy in verbose mode.
  if (config_.verbosity != BuildConfig::NORMAL)
    printer_.set_smart_terminal(false);

  progress_status_format_ = getenv("NINJA_STATUS");
  if (!progress_status_format_)
    progress_status_format_ = "[%f/%t] ";
}